

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O2

void __thiscall
wabt::TypeChecker::PrintStackIfFailed
          (TypeChecker *this,Result result,char *desc,TypeVector *expected)

{
  pointer pTVar1;
  pointer pTVar2;
  Result RVar3;
  undefined8 uVar4;
  char *pcVar5;
  char *prefix;
  char *pcVar6;
  char *pcVar7;
  undefined1 auStack_a8 [8];
  TypeVector actual;
  Label *label;
  string local_70;
  undefined8 local_50;
  string message;
  
  if (result.enum_ != Ok) {
    RVar3 = TopLabel(this,(Label **)
                          &actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    if (RVar3.enum_ == Ok) {
      uVar4 = *(undefined8 *)
               (actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage + 0xe);
    }
    else {
      uVar4 = Any;
    }
    auStack_a8 = (undefined1  [8])0x0;
    actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    actual.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    pTVar1 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    pTVar2 = (expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pcVar5 = &DAT_00000004;
    if (pTVar1 != pTVar2) {
      pcVar5 = (char *)((long)pTVar1 - (long)pTVar2 >> 2);
    }
    pcVar6 = (char *)(((long)(this->type_stack_).
                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(this->type_stack_).
                             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) - uVar4);
    pcVar7 = pcVar6;
    if (pcVar5 < pcVar6) {
      pcVar7 = pcVar5;
    }
    prefix = pcVar5;
    for (; pcVar7 != (char *)0x0; pcVar7 = pcVar7 + -1) {
      RVar3 = PeekType(this,(int)pcVar7 - 1,(Type *)&local_50);
      if (RVar3.enum_ != Ok) {
        __assert_fail("Succeeded(result)",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/type-checker.cc"
                      ,0x138,
                      "void wabt::TypeChecker::PrintStackIfFailed(Result, const char *, const TypeVector &)"
                     );
      }
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)auStack_a8,
                 (value_type *)&local_50);
    }
    std::__cxx11::string::string((string *)&local_50,"type mismatch in ",(allocator *)&local_70);
    std::__cxx11::string::append((string *)&local_50,desc);
    std::__cxx11::string::append((string *)&local_50,", expected ");
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)expected,(TypeVector *)0x0,prefix);
    std::__cxx11::string::append((string *)&local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::append((string *)&local_50," but got ");
    pcVar7 = (char *)0x0;
    if (pcVar5 < pcVar6) {
      pcVar7 = "... ";
    }
    (anonymous_namespace)::TypesToString_abi_cxx11_
              (&local_70,(_anonymous_namespace_ *)auStack_a8,(TypeVector *)pcVar7,prefix);
    std::__cxx11::string::append((string *)&local_50,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    PrintError(this,"%s",local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
              ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)auStack_a8);
  }
  return;
}

Assistant:

void TypeChecker::PrintStackIfFailed(Result result,
                                     const char* desc,
                                     const TypeVector& expected) {
  if (Succeeded(result)) {
    return;
  }

  size_t limit = 0;
  Label* label;
  if (Succeeded(TopLabel(&label))) {
    limit = label->type_stack_limit;
  }

  TypeVector actual;
  size_t max_depth = type_stack_.size() - limit;

  // In general we want to print as many values of the actual stack as were
  // expected. However, if the stack was expected to be empty, we should
  // print some amount of the actual stack.
  size_t actual_size;
  if (expected.size() == 0) {
    // Don't print too many elements if the stack is really deep.
    const size_t kMaxActualStackToPrint = 4;
    actual_size = std::min(kMaxActualStackToPrint, max_depth);
  } else {
    actual_size = std::min(expected.size(), max_depth);
  }

  bool incomplete_actual_stack = actual_size != max_depth;

  for (size_t i = 0; i < actual_size; ++i) {
    Type type;
    Result result = PeekType(actual_size - i - 1, &type);
    WABT_USE(result);
    assert(Succeeded(result));
    actual.push_back(type);
  }

  std::string message = "type mismatch in ";
  message += desc;
  message += ", expected ";
  message += TypesToString(expected);
  message += " but got ";
  message += TypesToString(actual, incomplete_actual_stack ? "... " : nullptr);

  PrintError("%s", message.c_str());
}